

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lws-spa.c
# Opt level: O0

lws_spa * lws_spa_create(lws *wsi,char **param_names,int count_params,int max_storage,
                        lws_spa_fileupload_cb opt_cb,void *opt_data)

{
  lws_spa *plVar1;
  undefined1 local_68 [8];
  lws_spa_create_info_t i;
  void *opt_data_local;
  lws_spa_fileupload_cb opt_cb_local;
  int max_storage_local;
  int count_params_local;
  char **param_names_local;
  lws *wsi_local;
  
  i.ac_chunk_size = (size_t)opt_data;
  memset(local_68,0,0x38);
  i.opt_cb = (lws_spa_fileupload_cb)i.ac_chunk_size;
  local_68 = (undefined1  [8])param_names;
  i.param_names._0_4_ = count_params;
  i.param_names._4_4_ = max_storage;
  i._8_8_ = opt_cb;
  plVar1 = lws_spa_create_via_info(wsi,(lws_spa_create_info_t *)local_68);
  return plVar1;
}

Assistant:

struct lws_spa *
lws_spa_create(struct lws *wsi, const char * const *param_names,
	       int count_params, int max_storage,
	       lws_spa_fileupload_cb opt_cb, void *opt_data)
{
	lws_spa_create_info_t i;

	memset(&i, 0, sizeof(i));
	i.count_params = count_params;
	i.max_storage = max_storage;
	i.opt_cb = opt_cb;
	i.opt_data = opt_data;
	i.param_names = param_names;

	return lws_spa_create_via_info(wsi, &i);
}